

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-homedir.c
# Opt level: O2

int run_test_homedir(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uStack_420;
  size_t len;
  char homedir [1024];
  
  len = 0x400;
  homedir[0] = '\0';
  iVar1 = uv_os_homedir();
  if (iVar1 == 0) {
    sVar2 = strlen(homedir);
    if (sVar2 == len) {
      if (sVar2 == 0) {
        pcVar3 = "len > 0";
        uStack_420 = 0x29;
      }
      else if (homedir[sVar2] == '\0') {
        if (sVar2 == 1) {
          if (homedir[0] != '/') {
            pcVar3 = "homedir[0] == \'/\'";
            uStack_420 = 0x33;
            goto LAB_0013196d;
          }
        }
        else if (homedir[sVar2 - 1] == '/') {
          pcVar3 = "homedir[len - 1] != \'/\'";
          uStack_420 = 0x35;
          goto LAB_0013196d;
        }
        len = 1;
        iVar1 = uv_os_homedir(homedir);
        if (iVar1 == -0x69) {
          if (len < 2) {
            pcVar3 = "len > SMALLPATH";
            uStack_420 = 0x3c;
          }
          else {
            iVar1 = uv_os_homedir(0,&len);
            if (iVar1 == -0x16) {
              iVar1 = uv_os_homedir(homedir,0);
              if (iVar1 == -0x16) {
                len = 0;
                iVar1 = uv_os_homedir(homedir);
                if (iVar1 == -0x16) {
                  return 0;
                }
                pcVar3 = "r == UV_EINVAL";
                uStack_420 = 0x45;
              }
              else {
                pcVar3 = "r == UV_EINVAL";
                uStack_420 = 0x42;
              }
            }
            else {
              pcVar3 = "r == UV_EINVAL";
              uStack_420 = 0x40;
            }
          }
        }
        else {
          pcVar3 = "r == UV_ENOBUFS";
          uStack_420 = 0x3b;
        }
      }
      else {
        pcVar3 = "homedir[len] == \'\\0\'";
        uStack_420 = 0x2a;
      }
    }
    else {
      pcVar3 = "strlen(homedir) == len";
      uStack_420 = 0x28;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_420 = 0x27;
  }
LAB_0013196d:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-homedir.c"
          ,uStack_420,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(homedir) {
  char homedir[PATHMAX];
  size_t len;
  int r;

  /* Test the normal case */
  len = sizeof homedir;
  homedir[0] = '\0';
  ASSERT(strlen(homedir) == 0);
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == 0);
  ASSERT(strlen(homedir) == len);
  ASSERT(len > 0);
  ASSERT(homedir[len] == '\0');

#ifdef _WIN32
  if (len == 3 && homedir[1] == ':')
    ASSERT(homedir[2] == '\\');
  else
    ASSERT(homedir[len - 1] != '\\');
#else
  if (len == 1)
    ASSERT(homedir[0] == '/');
  else
    ASSERT(homedir[len - 1] != '/');
#endif

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(len > SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_homedir(NULL, &len);
  ASSERT(r == UV_EINVAL);
  r = uv_os_homedir(homedir, NULL);
  ASSERT(r == UV_EINVAL);
  len = 0;
  r = uv_os_homedir(homedir, &len);
  ASSERT(r == UV_EINVAL);

  return 0;
}